

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O1

void __thiscall
presolve::HighsPostsolveStack::removedFixedCol<HighsEmptySlice>
          (HighsPostsolveStack *this,HighsInt col,double fixValue,double colCost,
          HighsMatrixSlice<HighsEmptySlice> *colVec)

{
  int iVar1;
  pointer pNVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  size_t position;
  ReductionType local_41;
  double local_40;
  double local_38;
  unsigned_long local_30;
  
  pNVar2 = (this->colValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->colValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar2) {
    (this->colValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar2;
  }
  pcVar3 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = fixValue;
  local_38 = colCost;
  std::vector<char,_std::allocator<char>_>::resize
            (&(this->reductionValues).data,(size_type)(pcVar3 + (0x18 - (long)pcVar4)));
  pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(double *)(pcVar3 + ((long)pcVar5 - (long)pcVar4)) = local_40;
  *(double *)(pcVar3 + (long)(pcVar5 + (8 - (long)pcVar4))) = local_38;
  *(int *)(pcVar3 + (long)(pcVar5 + (0x10 - (long)pcVar4))) = iVar1;
  pcVar3[(long)(pcVar5 + (0x14 - (long)pcVar4))] = '\x04';
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,&this->colValues);
  local_41 = kFixedCol;
  local_30 = (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
  ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
            ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
              *)&this->reductions,&local_41,&local_30);
  return;
}

Assistant:

void removedFixedCol(HighsInt col, double fixValue, double colCost,
                       const HighsMatrixSlice<ColStorageFormat>& colVec) {
    assert(std::isfinite(fixValue));
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(FixedCol{fixValue, colCost, origColIndex[col],
                                  HighsBasisStatus::kNonbasic});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kFixedCol);
  }